

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O2

int Cba_StrCmpInt(char *p1,char *p2,int i)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  char cVar10;
  
  cVar1 = p1[i];
  if ((((byte)(cVar1 - 0x3aU) < 0xf6) && (cVar10 = p2[i], (byte)(cVar10 - 0x3aU) < 0xf6)) ||
     (((uVar6 = (ulong)(uint)i, i < 1 || ((byte)(p1[uVar6 - 1] - 0x3aU) < 0xf6)) &&
      (cVar10 = p2[i], (byte)(cVar10 - 0x3aU) < 0xf6 || (byte)(cVar1 - 0x3aU) < 0xf6)))) {
    if (cVar1 < cVar10) {
      return -1;
    }
    if (cVar1 <= cVar10) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                    ,0x19e,"int Cba_StrCmpInt(char *, char *, int)");
    }
  }
  else {
    uVar7 = i >> 0x1f & i;
    uVar9 = uVar6;
    do {
      uVar9 = uVar9 - 1;
      uVar2 = (uint)uVar6;
      uVar8 = uVar7;
      uVar3 = uVar7 - 1;
      if ((int)uVar2 < 1) break;
      uVar3 = uVar2 - 1;
      uVar6 = (ulong)uVar3;
      uVar8 = uVar2;
    } while (0xf5 < (byte)(p1[uVar9 & 0xffffffff] - 0x3aU));
    if ((byte)(p1[(int)uVar8] - 0x3aU) < 0xf6) {
      __assert_fail("Cba_CharIsDigit(p1[i])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                    ,0x189,"int Cba_StrCmpInt(char *, char *, int)");
    }
    if ((byte)(p2[(int)uVar8] - 0x3aU) < 0xf6) {
      __assert_fail("Cba_CharIsDigit(p2[i])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                    ,0x18a,"int Cba_StrCmpInt(char *, char *, int)");
    }
    if (uVar8 != 0) {
      if (0xf5 < (byte)(p1[(int)uVar3] - 0x3aU)) {
        __assert_fail("i == 0 || !Cba_CharIsDigit(p1[i-1])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                      ,0x18c,"int Cba_StrCmpInt(char *, char *, int)");
      }
      if (0xf5 < (byte)(p2[(int)uVar3] - 0x3aU)) {
        __assert_fail("i == 0 || !Cba_CharIsDigit(p2[i-1])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                      ,0x18d,"int Cba_StrCmpInt(char *, char *, int)");
      }
    }
    iVar4 = atoi(p1 + (int)uVar8);
    iVar5 = atoi(p2 + (int)uVar8);
    if (iVar4 < iVar5) {
      return -1;
    }
    if (iVar4 <= iVar5) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                    ,0x195,"int Cba_StrCmpInt(char *, char *, int)");
    }
  }
  return 1;
}

Assistant:

int Cba_StrCmpInt( char * p1, char * p2, int i )
{
    // check if one of the mismatching chars is a digit
    if ( Cba_CharIsDigit(p1[i]) || Cba_CharIsDigit(p2[i]) )
    {
        // if previous (equal) char was a digit or if this is first digit on both sides, scroll back
        if ( (i > 0 && Cba_CharIsDigit(p1[i-1])) || (Cba_CharIsDigit(p1[i]) && Cba_CharIsDigit(p2[i])) )
        {
            int Num1, Num2;
            // find the first digit
            for ( --i; i >= 0; i-- )
                if ( !Cba_CharIsDigit(p1[i]) )
                    break;
            i++;
            // current char is digit
            assert( Cba_CharIsDigit(p1[i]) );
            assert( Cba_CharIsDigit(p2[i]) );
            // previous char does not exist or is not a digit
            assert( i == 0 || !Cba_CharIsDigit(p1[i-1]) );
            assert( i == 0 || !Cba_CharIsDigit(p2[i-1]) );
            // compare numbers
            Num1 = atoi( p1 + i );
            Num2 = atoi( p2 + i );
            if ( Num1 < Num2 )
                return -1;
            if ( Num1 > Num2 ) 
                return 1;
            assert( 0 );
            return 0;
        }
    }
    // compare as usual
    if ( p1[i] < p2[i] )
        return -1;
    if ( p1[i] > p2[i] )
        return 1;
    assert( 0 );
    return 0;
}